

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

void trstep_ddl(double *jac,double *sN,int N,double *dx,double maxstep,double *L,double *hess,
               double nlen,double *ioval,double *ssd,double *v,double *step)

{
  double dVar1;
  double dVar2;
  double *vec;
  double *C;
  double *C_00;
  double *C_01;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_98;
  double local_40;
  
  dVar11 = *ioval;
  local_40 = ioval[1];
  dVar12 = ioval[2];
  vec = (double *)malloc((long)N << 3);
  C = (double *)malloc(8);
  C_00 = (double *)malloc(8);
  C_01 = (double *)malloc(8);
  if (nlen <= dVar11) {
    ioval[6] = 1.0;
    dVar11 = nlen;
    if (0 < N) {
      uVar3 = 0;
      do {
        step[uVar3] = sN[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)N != uVar3);
    }
  }
  else {
    ioval[6] = 0.0;
    if ((ioval[7] == 1.0) && (!NAN(ioval[7]))) {
      ioval[7] = 0.0;
      if (N < 1) {
        local_98 = l2norm(vec,N);
        local_98 = local_98 * local_98;
        local_40 = 0.0;
      }
      else {
        uVar9 = (ulong)(uint)N;
        uVar3 = 0;
        do {
          vec[uVar3] = jac[uVar3] / dx[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar9 != uVar3);
        local_98 = l2norm(vec,N);
        local_98 = local_98 * local_98;
        if (N < 1) {
          local_40 = 0.0;
        }
        else {
          local_40 = 0.0;
          uVar4 = 0;
          uVar3 = uVar9;
          pdVar5 = jac;
          pdVar8 = dx;
          do {
            uVar6 = 0;
            dVar12 = 0.0;
            pdVar7 = L;
            do {
              dVar12 = dVar12 + (*pdVar7 * pdVar5[uVar6]) / (pdVar8[uVar6] * pdVar8[uVar6]);
              pdVar7 = pdVar7 + uVar9;
              uVar6 = uVar6 + 1;
            } while (uVar3 != uVar6);
            local_40 = local_40 + dVar12 * dVar12;
            uVar4 = uVar4 + 1;
            L = L + uVar9 + 1;
            pdVar8 = pdVar8 + 1;
            pdVar5 = pdVar5 + 1;
            uVar3 = uVar3 - 1;
          } while (uVar4 != uVar9);
          if (0 < N) {
            uVar3 = 0;
            do {
              ssd[uVar3] = (jac[uVar3] * (-local_98 / local_40)) / dx[uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar9 != uVar3);
          }
        }
      }
      mmult(jac,sN,C,1,N,1);
      dVar12 = (local_98 * 0.8 * local_98) / (ABS(*C) * local_40) + 0.2;
      if (0 < N) {
        uVar3 = 0;
        do {
          v[uVar3] = dx[uVar3] * dVar12 * sN[uVar3] - ssd[uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)N != uVar3);
      }
      local_40 = (SQRT(local_98) * local_98) / local_40;
      if (((dVar11 == -1.0) && (!NAN(dVar11))) && (dVar11 = local_40, maxstep <= local_40)) {
        dVar11 = maxstep;
      }
    }
    if (dVar12 * nlen <= dVar11) {
      if (0 < N) {
        uVar3 = 0;
        do {
          step[uVar3] = sN[uVar3] * (dVar11 / nlen);
          uVar3 = uVar3 + 1;
        } while ((uint)N != uVar3);
      }
    }
    else if (dVar11 <= local_40) {
      if (0 < N) {
        uVar3 = 0;
        do {
          step[uVar3] = (ssd[uVar3] * (dVar11 / local_40)) / dx[uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)N != uVar3);
      }
    }
    else {
      mmult(v,ssd,C_00,1,N,1);
      mmult(v,v,C_01,1,N,1);
      dVar1 = *C_00;
      dVar10 = dVar1 * dVar1 - (local_40 * local_40 - dVar11 * dVar11) * *C_01;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      if (0 < N) {
        dVar2 = *C_01;
        uVar3 = 0;
        do {
          step[uVar3] = (v[uVar3] * ((dVar10 - dVar1) / dVar2)) / dx[uVar3] + ssd[uVar3] / dx[uVar3]
          ;
          uVar3 = uVar3 + 1;
        } while ((uint)N != uVar3);
      }
    }
  }
  *ioval = dVar11;
  ioval[1] = local_40;
  ioval[2] = dVar12;
  free(vec);
  free(C_00);
  free(C_01);
  free(C);
  return;
}

Assistant:

void trstep_ddl(double *jac,double *sN,int N,double * dx,double maxstep,double *L,double *hess,double nlen,double *ioval,
		double *ssd,double *v,double *step) {
	int i,j;
	double tvec,temp;
	double alpha,beta;
	double delta,clen,neta,lambda;
	double *temp1,*slstep;
	double *t1,*t2;
	
	
	delta = ioval[0];clen = ioval[1]; neta = ioval[2];
	
	temp1 = (double*) malloc(sizeof(double) *N);
	slstep = (double*) malloc(sizeof(double) *1);
	t1 = (double*) malloc(sizeof(double) *1);
	t2 = (double*) malloc(sizeof(double) *1);
	
	if (nlen <= delta) {
		ioval[6] = 1.0;
		for(i=0;i <N;++i) {
			step[i] = sN[i];
		}
		delta = nlen;
		
	} else {
		ioval[6] = 0.0;
		if (ioval[7] == 1.0) {
			ioval[7] = 0.0;
			for(i=0;i < N;++i) {
				temp1[i] = jac[i] / dx[i];
			}
			
			tvec = l2norm(temp1,N);
			alpha = tvec*tvec;
			beta = 0.0; 
			
			for (i = 0; i < N;++i) {
				temp = 0.0;
				for(j = i; j < N;++j) {
					temp += L[j*N + i] * jac[j] /(dx[j] * dx[j]);
				}
				beta += temp*temp;
			}
			tvec = - alpha / beta;
			for (i = 0; i < N;++i) {
				ssd[i] = tvec * jac[i] / dx[i];
			}
			
			clen = alpha * sqrt(alpha) / beta;
			mmult(jac,sN,slstep,1,N,1);
			neta = 0.2 + ((0.8 * alpha * alpha) /(beta *fabs(slstep[0])));
			
			for (i = 0; i < N;++i) {
				v[i] = neta * dx[i] *sN[i] - ssd[i];
			}
			
			if (delta == -1.0) {
				if (clen < maxstep) {
					delta = clen;
				} else {
					delta = maxstep;
				}
			}
			
		}
		
		if (neta * nlen <= delta) {
			tvec = delta / nlen;
			for(i = 0; i < N;++i) {
				step[i] = tvec * sN[i];
			}
		} else if (clen >= delta) {
			tvec = delta /clen;
			for (i = 0; i < N;++i) {
				step[i] = tvec * ssd[i] / dx[i];
			}
		} else {
			mmult(v,ssd,t1,1,N,1);
			mmult(v,v,t2,1,N,1);
			lambda = (-t1[0] + sqrt(t1[0]*t1[0] - t2[0]*(clen*clen - delta*delta)))/t2[0];
			
			for (i = 0; i < N; ++i) {
				step[i] = (ssd[i] / dx[i]) + (lambda * v[i] / dx[i] );
			}
		}
		
			
	}
	
	ioval[0] = delta; ioval[1] = clen; ioval[2] = neta;
	
	free(temp1);
	free(t1);
	free(t2);
	free(slstep);
}